

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O2

void ncnn::transpose_pack_B_tile_int8_avx512vnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [64];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined1 *puVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM4 [64];
  long local_90;
  long local_80;
  long local_78;
  long local_50;
  
  iVar7 = B->w;
  lVar2 = (long)iVar7;
  pauVar11 = (undefined1 (*) [64])BT->data;
  lVar12 = (long)k;
  lVar20 = (long)(iVar7 * 2);
  lVar19 = (long)(iVar7 * 4);
  lVar24 = (long)j;
  lVar3 = (long)max_jj;
  lVar21 = iVar7 * 3 + lVar24;
  lVar10 = lVar24 + lVar20;
  lVar13 = (iVar7 * 3 + 1) + lVar24;
  local_80 = (iVar7 + 1) + lVar24;
  lVar17 = (iVar7 + 3) + lVar24;
  local_50 = (iVar7 + 2) + lVar24;
  auVar26 = vpbroadcastb_avx512bw(ZEXT116(0x7f));
  local_90 = lVar2 + lVar24;
  local_78 = lVar24 + lVar20 + 1;
  for (uVar8 = 0; (long)(uVar8 | 0xf) < lVar3; uVar8 = uVar8 + 0x10) {
    pvVar1 = B->data;
    lVar15 = B->w * lVar12 * B->elemsize;
    lVar4 = (long)pvVar1 + lVar24;
    lVar14 = (long)pvVar1 + lVar21;
    lVar9 = lVar10 + (long)pvVar1;
    lVar18 = (long)pvVar1 + local_90;
    for (iVar7 = 0; iVar7 + 3 < max_kk; iVar7 = iVar7 + 4) {
      auVar33 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar4 + lVar15),
                               *(undefined1 (*) [16])(lVar18 + lVar15));
      auVar29 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar4 + lVar15),
                               *(undefined1 (*) [16])(lVar18 + lVar15));
      auVar36 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar9 + lVar15),
                               *(undefined1 (*) [16])(lVar14 + lVar15));
      auVar25 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar9 + lVar15),
                               *(undefined1 (*) [16])(lVar14 + lVar15));
      auVar30 = vpunpcklwd_avx(auVar33,auVar36);
      in_ZMM4 = ZEXT1664(auVar30);
      auVar33 = vpunpckhwd_avx(auVar33,auVar36);
      auVar36 = vpunpcklwd_avx(auVar29,auVar25);
      auVar29 = vpunpckhwd_avx(auVar29,auVar25);
      auVar31._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar36;
      auVar31._16_16_ = ZEXT116(1) * auVar29;
      auVar27 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar33,
                                               ZEXT116(0) * auVar33 + ZEXT116(1) * auVar30)),auVar31
                           ,1);
      auVar27 = vpaddb_avx512bw(auVar27,auVar26);
      auVar27 = vmovdqu64_avx512f(auVar27);
      *pauVar11 = auVar27;
      pauVar11 = pauVar11 + 1;
      lVar4 = lVar4 + lVar19;
      lVar14 = lVar14 + lVar19;
      lVar9 = lVar9 + lVar19;
      lVar18 = lVar18 + lVar19;
    }
    for (; iVar7 + 1 < max_kk; iVar7 = iVar7 + 2) {
      auVar25 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar4 + lVar15),
                               *(undefined1 (*) [16])(lVar18 + lVar15));
      auVar29 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar4 + lVar15),
                               *(undefined1 (*) [16])(lVar18 + lVar15));
      *(undefined1 (*) [16])*pauVar11 = auVar25;
      *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar29;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
      lVar4 = lVar4 + lVar20;
      lVar18 = lVar18 + lVar20;
    }
    pauVar5 = (undefined1 (*) [16])(lVar4 + lVar15);
    for (; iVar7 < max_kk; iVar7 = iVar7 + 1) {
      *(undefined1 (*) [16])*pauVar11 = *pauVar5;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
      pauVar5 = (undefined1 (*) [16])(*pauVar5 + lVar2);
    }
    lVar24 = lVar24 + 0x10;
    lVar21 = lVar21 + 0x10;
    lVar10 = lVar10 + 0x10;
    local_90 = local_90 + 0x10;
    lVar13 = lVar13 + 0x10;
    local_80 = local_80 + 0x10;
    local_78 = local_78 + 0x10;
    lVar17 = lVar17 + 0x10;
    local_50 = local_50 + 0x10;
  }
  auVar28[8] = 0x7f;
  auVar28._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar28[9] = 0x7f;
  auVar28[10] = 0x7f;
  auVar28[0xb] = 0x7f;
  auVar28[0xc] = 0x7f;
  auVar28[0xd] = 0x7f;
  auVar28[0xe] = 0x7f;
  auVar28[0xf] = 0x7f;
  auVar28[0x10] = 0x7f;
  auVar28[0x11] = 0x7f;
  auVar28[0x12] = 0x7f;
  auVar28[0x13] = 0x7f;
  auVar28[0x14] = 0x7f;
  auVar28[0x15] = 0x7f;
  auVar28[0x16] = 0x7f;
  auVar28[0x17] = 0x7f;
  auVar28[0x18] = 0x7f;
  auVar28[0x19] = 0x7f;
  auVar28[0x1a] = 0x7f;
  auVar28[0x1b] = 0x7f;
  auVar28[0x1c] = 0x7f;
  auVar28[0x1d] = 0x7f;
  auVar28[0x1e] = 0x7f;
  auVar28[0x1f] = 0x7f;
  for (; auVar29 = _DAT_0053a830, (long)(uVar8 | 7) < lVar3; uVar8 = uVar8 + 8) {
    pvVar1 = B->data;
    lVar15 = B->w * lVar12 * B->elemsize;
    lVar4 = (long)pvVar1 + lVar24;
    lVar14 = (long)pvVar1 + lVar21;
    lVar9 = lVar10 + (long)pvVar1;
    lVar18 = (long)pvVar1 + local_90;
    for (iVar7 = 0; iVar7 + 3 < max_kk; iVar7 = iVar7 + 4) {
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar4 + lVar15);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(lVar18 + lVar15);
      auVar29 = vpunpcklbw_avx(auVar29,auVar25);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar9 + lVar15);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar14 + lVar15);
      auVar25 = vpunpcklbw_avx(auVar33,auVar36);
      auVar33 = vpunpcklwd_avx(auVar29,auVar25);
      auVar29 = vpunpckhwd_avx(auVar29,auVar25);
      auVar32._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar33;
      auVar32._16_16_ = ZEXT116(1) * auVar29;
      auVar31 = vpaddb_avx2(auVar32,auVar28);
      *(undefined1 (*) [32])*pauVar11 = auVar31;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
      lVar4 = lVar4 + lVar19;
      lVar14 = lVar14 + lVar19;
      lVar9 = lVar9 + lVar19;
      lVar18 = lVar18 + lVar19;
    }
    for (; iVar7 + 1 < max_kk; iVar7 = iVar7 + 2) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar4 + lVar15);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar18 + lVar15);
      auVar29 = vpunpcklbw_avx(auVar30,auVar34);
      *(undefined1 (*) [16])*pauVar11 = auVar29;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
      lVar4 = lVar4 + lVar20;
      lVar18 = lVar18 + lVar20;
    }
    puVar6 = (undefined8 *)(lVar4 + lVar15);
    for (; iVar7 < max_kk; iVar7 = iVar7 + 1) {
      *(undefined8 *)*pauVar11 = *puVar6;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 8);
      puVar6 = (undefined8 *)((long)puVar6 + lVar2);
    }
    lVar24 = lVar24 + 8;
    lVar21 = lVar21 + 8;
    lVar10 = lVar10 + 8;
    local_90 = local_90 + 8;
    lVar13 = lVar13 + 8;
    local_80 = local_80 + 8;
    local_78 = local_78 + 8;
    lVar17 = lVar17 + 8;
    local_50 = local_50 + 8;
  }
  auVar25 = vpbroadcastd_avx512vl();
  vpmulld_avx(auVar25,_DAT_0053a400);
  auVar35[8] = 0x7f;
  auVar35._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar35[9] = 0x7f;
  auVar35[10] = 0x7f;
  auVar35[0xb] = 0x7f;
  auVar35[0xc] = 0x7f;
  auVar35[0xd] = 0x7f;
  auVar35[0xe] = 0x7f;
  auVar35[0xf] = 0x7f;
  for (; (long)(uVar8 | 3) < lVar3; uVar8 = uVar8 + 4) {
    pvVar1 = B->data;
    lVar22 = B->w * lVar12 * B->elemsize;
    lVar4 = lVar24 + (long)pvVar1;
    lVar14 = lVar17 + (long)pvVar1;
    lVar9 = local_50 + (long)pvVar1;
    lVar15 = local_80 + (long)pvVar1;
    lVar18 = (long)pvVar1 + local_90;
    iVar7 = 1;
    for (iVar23 = 0; iVar23 + 3 < max_kk; iVar23 = iVar23 + 4) {
      auVar25 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
      auVar25 = vpgatherdd((undefined1  [16])0x0,auVar25);
      in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
      auVar25 = vpshufb_avx(auVar25,auVar29);
      auVar25 = vpaddb_avx(auVar25,auVar35);
      *(undefined1 (*) [16])*pauVar11 = auVar25;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
      lVar4 = lVar4 + lVar19;
      lVar14 = lVar14 + lVar19;
      lVar9 = lVar9 + lVar19;
      lVar15 = lVar15 + lVar19;
      iVar7 = iVar7 + 4;
      lVar18 = lVar18 + lVar19;
    }
    for (; iVar7 < max_kk; iVar7 = iVar7 + 2) {
      (*pauVar11)[0] = *(undefined1 *)(lVar4 + lVar22);
      (*pauVar11)[1] = *(undefined1 *)(lVar18 + lVar22);
      (*pauVar11)[2] = *(undefined1 *)(lVar4 + 1 + lVar22);
      (*pauVar11)[3] = *(undefined1 *)(lVar15 + lVar22);
      (*pauVar11)[4] = *(undefined1 *)(lVar4 + 2 + lVar22);
      (*pauVar11)[5] = *(undefined1 *)(lVar9 + lVar22);
      (*pauVar11)[6] = *(undefined1 *)(lVar4 + 3 + lVar22);
      (*pauVar11)[7] = *(undefined1 *)(lVar14 + lVar22);
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 8);
      lVar4 = lVar4 + lVar20;
      lVar14 = lVar14 + lVar20;
      lVar9 = lVar9 + lVar20;
      lVar15 = lVar15 + lVar20;
      lVar18 = lVar18 + lVar20;
    }
    puVar16 = (undefined1 *)(lVar4 + lVar22);
    for (iVar7 = iVar7 + -1; iVar7 < max_kk; iVar7 = iVar7 + 1) {
      (*pauVar11)[0] = *puVar16;
      (*pauVar11)[1] = puVar16[1];
      (*pauVar11)[2] = puVar16[2];
      (*pauVar11)[3] = puVar16[3];
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 4);
      puVar16 = puVar16 + lVar2;
    }
    lVar24 = lVar24 + 4;
    lVar21 = lVar21 + 4;
    lVar10 = lVar10 + 4;
    local_90 = local_90 + 4;
    lVar13 = lVar13 + 4;
    local_80 = local_80 + 4;
    local_78 = local_78 + 4;
    lVar17 = lVar17 + 4;
    local_50 = local_50 + 4;
  }
  for (; (long)(uVar8 | 1) < lVar3; uVar8 = uVar8 + 2) {
    pvVar1 = B->data;
    lVar14 = B->w * lVar12 * B->elemsize;
    lVar17 = lVar24 + (long)pvVar1;
    lVar4 = lVar13 + (long)pvVar1;
    lVar9 = local_80 + (long)pvVar1;
    lVar15 = (long)pvVar1 + lVar21;
    lVar22 = local_78 + (long)pvVar1;
    lVar18 = (long)pvVar1 + local_90;
    iVar7 = 1;
    for (iVar23 = 3; iVar23 < max_kk; iVar23 = iVar23 + 4) {
      (*pauVar11)[0] = *(char *)(lVar17 + lVar14) + '\x7f';
      (*pauVar11)[1] = *(char *)(lVar18 + lVar14) + '\x7f';
      (*pauVar11)[2] = *(char *)(lVar22 + -1 + lVar14) + '\x7f';
      (*pauVar11)[3] = *(char *)(lVar15 + lVar14) + '\x7f';
      (*pauVar11)[4] = *(char *)(lVar17 + 1 + lVar14) + '\x7f';
      (*pauVar11)[5] = *(char *)(lVar9 + lVar14) + '\x7f';
      (*pauVar11)[6] = *(char *)(lVar22 + lVar14) + '\x7f';
      (*pauVar11)[7] = *(char *)(lVar4 + lVar14) + '\x7f';
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 8);
      lVar17 = lVar17 + lVar19;
      lVar4 = lVar4 + lVar19;
      lVar9 = lVar9 + lVar19;
      lVar15 = lVar15 + lVar19;
      lVar22 = lVar22 + lVar19;
      lVar18 = lVar18 + lVar19;
      iVar7 = iVar7 + 4;
    }
    for (; iVar7 < max_kk; iVar7 = iVar7 + 2) {
      (*pauVar11)[0] = *(undefined1 *)(lVar17 + lVar14);
      (*pauVar11)[1] = *(undefined1 *)(lVar18 + lVar14);
      (*pauVar11)[2] = *(undefined1 *)(lVar17 + 1 + lVar14);
      (*pauVar11)[3] = *(undefined1 *)(lVar9 + lVar14);
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 4);
      lVar17 = lVar17 + lVar20;
      lVar9 = lVar9 + lVar20;
      lVar18 = lVar18 + lVar20;
    }
    for (iVar7 = iVar7 + -1; iVar7 < max_kk; iVar7 = iVar7 + 1) {
      (*pauVar11)[0] = *(undefined1 *)(lVar17 + lVar14);
      (*pauVar11)[1] = *(undefined1 *)(lVar17 + 1 + lVar14);
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 2);
      lVar14 = lVar14 + lVar2;
    }
    lVar24 = lVar24 + 2;
    lVar21 = lVar21 + 2;
    lVar10 = lVar10 + 2;
    local_90 = local_90 + 2;
    lVar13 = lVar13 + 2;
    local_80 = local_80 + 2;
    local_78 = local_78 + 2;
  }
  for (; (long)uVar8 < lVar3; uVar8 = uVar8 + 1) {
    pvVar1 = B->data;
    lVar14 = B->w * lVar12 * B->elemsize;
    lVar13 = (long)pvVar1 + lVar24;
    lVar17 = (long)pvVar1 + lVar21;
    lVar4 = lVar10 + (long)pvVar1;
    lVar9 = (long)pvVar1 + local_90;
    for (lVar20 = 0; (int)lVar20 + 3 < max_kk; lVar20 = lVar20 + 4) {
      (*pauVar11)[lVar20] = *(char *)(lVar13 + lVar14) + '\x7f';
      (*pauVar11)[lVar20 + 1] = *(char *)(lVar9 + lVar14) + '\x7f';
      (*pauVar11)[lVar20 + 2] = *(char *)(lVar4 + lVar14) + '\x7f';
      (*pauVar11)[lVar20 + 3] = *(char *)(lVar17 + lVar14) + '\x7f';
      lVar13 = lVar13 + lVar19;
      lVar17 = lVar17 + lVar19;
      lVar4 = lVar4 + lVar19;
      lVar9 = lVar9 + lVar19;
    }
    puVar16 = (undefined1 *)(lVar13 + lVar14);
    for (; (int)lVar20 < max_kk; lVar20 = lVar20 + 1) {
      (*pauVar11)[lVar20] = *puVar16;
      puVar16 = puVar16 + lVar2;
    }
    lVar24 = lVar24 + 1;
    lVar21 = lVar21 + 1;
    lVar10 = lVar10 + 1;
    local_90 = local_90 + 1;
    pauVar11 = (undefined1 (*) [64])(*pauVar11 + lVar20);
  }
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avx512vnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}